

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O1

void __thiscall LinkedList::prepend(LinkedList *this,Node **head,int data)

{
  Node *pNVar1;
  
  pNVar1 = (Node *)operator_new(0x10);
  *(undefined8 *)pNVar1 = 0;
  pNVar1->next = (Node *)0x0;
  pNVar1->data = data;
  if (*head != (Node *)0x0) {
    pNVar1->next = *head;
  }
  *head = pNVar1;
  return;
}

Assistant:

void LinkedList::prepend(Node** head, int data) {
	// Allocate new node
	Node* prev = new Node();

	// Add next node attribute
	prev->next = NULL;

	// Add data attribute
	prev->data = data;

	// if head is null
	if (*head == nullptr) {
		*head = prev;
		return;
	}

	prev->next = *head;
	*head = prev;
}